

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.h
# Opt level: O3

void __thiscall Network::add_link(Network *this,uint node_i,uint node_j)

{
  pointer psVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  bool bVar5;
  uint local_20;
  uint local_1c;
  
  psVar1 = (this->links).
           super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  p_Var2 = *(_Base_ptr *)((long)&psVar1[node_i]._M_t._M_impl.super__Rb_tree_header + 8);
  local_20 = node_j;
  local_1c = node_i;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var4 = &psVar1[node_i]._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var3 = p_Var4;
    do {
      bVar5 = p_Var2[1]._M_color < node_j;
      if (!bVar5) {
        p_Var3 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[bVar5];
    } while (p_Var2 != (_Base_ptr)0x0);
    if ((p_Var3 != p_Var4) && (p_Var3[1]._M_color <= node_j)) {
      __assert_fail("links[node_i].count(node_j) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SamplingConstrainedNetworks[P]code/source/network.h"
                    ,0xb0,"void Network::add_link(unsigned int, unsigned int)");
    }
  }
  update_triangles(this,node_i,node_j,true);
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_insert_unique<unsigned_int_const&>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)((this->links).
                 super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + node_i),&local_20);
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_insert_unique<unsigned_int_const&>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)((this->links).
                 super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + local_20),&local_1c);
  return;
}

Assistant:

void add_link(unsigned int node_i, unsigned int node_j) {
        assert(links[node_i].count(node_j) == 0);  // link must not exist

        update_triangles(node_i, node_j, true);

        links[node_i].insert(node_j);
        links[node_j].insert(node_i);
    }